

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * prioritisetransaction(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff648;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff650;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff680;
  allocator<char> *in_stack_fffffffffffff688;
  undefined1 *puVar2;
  iterator in_stack_fffffffffffff690;
  RPCArgOptions *in_stack_fffffffffffff698;
  string *in_stack_fffffffffffff6a0;
  Fallback *in_stack_fffffffffffff6a8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff6b0;
  string *in_stack_fffffffffffff6b8;
  RPCArg *in_stack_fffffffffffff6c0;
  RPCResult *result;
  RPCResults *this_00;
  RPCResult *this_01;
  undefined8 in_stack_fffffffffffff790;
  undefined8 in_stack_fffffffffffff798;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff7a0;
  pointer description;
  _Alloc_hider name;
  pointer this_02;
  undefined1 local_83a;
  undefined1 local_839 [39];
  allocator<char> local_812;
  allocator<char> local_811 [7];
  allocator<char> local_80a;
  allocator<char> local_809 [8];
  allocator<char> local_801 [31];
  allocator<char> local_7e2;
  allocator<char> local_7e1 [145];
  RPCMethodImpl *in_stack_fffffffffffff8b0;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  local_809[1] = (allocator<char>)0x0;
  local_809[2] = (allocator<char>)0x0;
  local_809[3] = (allocator<char>)0x0;
  local_809[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff658,(Optional *)in_stack_fffffffffffff650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::__cxx11::string::string(in_stack_fffffffffffff660);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff648);
  RPCArg::RPCArg(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
                 (Type)((ulong)in_stack_fffffffffffff6b0 >> 0x20),in_stack_fffffffffffff6a8,
                 in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  local_811[1] = (allocator<char>)0x1;
  local_811[2] = (allocator<char>)0x0;
  local_811[3] = (allocator<char>)0x0;
  local_811[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff658,(Optional *)in_stack_fffffffffffff650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::__cxx11::string::string(in_stack_fffffffffffff660);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff648);
  RPCArg::RPCArg(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
                 (Type)((ulong)in_stack_fffffffffffff6b0 >> 0x20),in_stack_fffffffffffff6a8,
                 in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  local_839._33_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff658,(Optional *)in_stack_fffffffffffff650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::__cxx11::string::string(in_stack_fffffffffffff660);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff648);
  RPCArg::RPCArg(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
                 (Type)((ulong)in_stack_fffffffffffff6b0 >> 0x20),in_stack_fffffffffffff6a8,
                 in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff6a8 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff648);
  __l._M_len = (size_type)in_stack_fffffffffffff698;
  __l._M_array = in_stack_fffffffffffff690;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff688,__l,
             (allocator_type *)in_stack_fffffffffffff680);
  this_01 = (RPCResult *)local_839;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  this_00 = (RPCResults *)&local_83a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  description = (pointer)0x0;
  name._M_p = (pointer)0x0;
  this_02 = (pointer)0x0;
  result = (RPCResult *)&stack0xfffffffffffff7a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff648);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),(string *)result,in_stack_fffffffffffff6b8,
             in_stack_fffffffffffff6b0,(bool)skip_type_check);
  RPCResults::RPCResults(this_00,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  HelpExampleCli(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  HelpExampleRpc(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  std::operator+(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff648,(string *)0x131d0d6);
  this = (RPCArg *)&stack0xfffffffffffff780;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<prioritisetransaction()::__0,void>(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)this_02,(string *)name._M_p,&description->m_names,
             in_stack_fffffffffffff7a0,(RPCResults *)in_stack_fffffffffffff798,
             (RPCExamples *)in_stack_fffffffffffff790,in_stack_fffffffffffff8b0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7a4);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7a5);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7a6);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff7a7);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff658);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_83a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_839);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff658);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_839 + 0x20));
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_812);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_811);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_80a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_809);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_801);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7e2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_7e1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan prioritisetransaction()
{
    return RPCHelpMan{"prioritisetransaction",
                "Accepts the transaction into mined blocks at a higher (or lower) priority\n",
                {
                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id."},
                    {"dummy", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "API-Compatibility for previous API. Must be zero or null.\n"
            "                  DEPRECATED. For forward compatibility use named arguments and omit this parameter."},
                    {"fee_delta", RPCArg::Type::NUM, RPCArg::Optional::NO, "The fee value (in satoshis) to add (or subtract, if negative).\n"
            "                  Note, that this value is not a fee rate. It is a value to modify absolute fee of the TX.\n"
            "                  The fee is not actually paid, only the algorithm for selecting transactions into a block\n"
            "                  considers the transaction as it would have paid a higher (or lower) fee."},
                },
                RPCResult{
                    RPCResult::Type::BOOL, "", "Returns true"},
                RPCExamples{
                    HelpExampleCli("prioritisetransaction", "\"txid\" 0.0 10000")
            + HelpExampleRpc("prioritisetransaction", "\"txid\", 0.0, 10000")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    LOCK(cs_main);

    uint256 hash(ParseHashV(request.params[0], "txid"));
    const auto dummy{self.MaybeArg<double>("dummy")};
    CAmount nAmount = request.params[2].getInt<int64_t>();

    if (dummy && *dummy != 0) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Priority is no longer supported, dummy argument to prioritisetransaction must be 0.");
    }

    EnsureAnyMemPool(request.context).PrioritiseTransaction(hash, nAmount);
    return true;
},
    };
}